

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath_test.cpp
# Opt level: O2

void __thiscall Bounds2_IteratorBasic_Test::TestBody(Bounds2_IteratorBasic_Test *this)

{
  int iVar1;
  int iVar2;
  Bounds2i *pBVar3;
  char *pcVar4;
  Bounds2iIterator BVar5;
  int offset;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  AssertionResult gtest_ar;
  AssertHelper local_90;
  Bounds2iIterator __begin1;
  Point2i p;
  Tuple2<pbrt::Point2,_int> local_68 [5];
  Bounds2i b;
  
  b.pMin.super_Tuple2<pbrt::Point2,_int>.x = 0;
  b.pMin.super_Tuple2<pbrt::Point2,_int>.y = 1;
  b.pMax.super_Tuple2<pbrt::Point2,_int>.x = 2;
  b.pMax.super_Tuple2<pbrt::Point2,_int>.y = 3;
  offset = 0;
  __begin1.p.super_Tuple2<pbrt::Point2,_int>.x = 0;
  __begin1.p.super_Tuple2<pbrt::Point2,_int>.y = 1;
  local_68[0].x = 0;
  local_68[0].y = 1;
  local_68[1].x = 1;
  local_68[1].y = 1;
  local_68[2].x = 0;
  local_68[2].y = 2;
  local_68[3].x = 1;
  local_68[3].y = 2;
  __begin1.bounds = &b;
  BVar5 = pbrt::end(&b);
  pBVar3 = &b;
  iVar1 = 0;
  iVar2 = 1;
  while (((iVar1 != BVar5.p.super_Tuple2<pbrt::Point2,_int>.x ||
          (iVar2 != BVar5.p.super_Tuple2<pbrt::Point2,_int>.y)) || (pBVar3 != BVar5.bounds))) {
    local_a8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4;
    p = __begin1.p;
    testing::internal::CmpHelperLT<int,unsigned_long>
              ((internal *)&gtest_ar,"offset","(sizeof(::pbrt::detail::ArraySizeHelper(e)))",&offset
               ,(unsigned_long *)&local_a8);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_a8);
      pcVar4 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/vecmath_test.cpp"
                 ,0xc5,pcVar4);
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_a8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    testing::internal::CmpHelperEQ<pbrt::Point2<int>,pbrt::Point2<int>>
              ((internal *)&gtest_ar,"e[offset]","p",(Point2<int> *)(local_68 + offset),&p);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_a8);
      std::operator<<((ostream *)(local_a8.ptr_ + 0x10),"offset = ");
      std::ostream::operator<<(local_a8.ptr_ + 0x10,offset);
      pcVar4 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/vecmath_test.cpp"
                 ,0xc6,pcVar4);
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_a8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    offset = offset + 1;
    pbrt::Bounds2iIterator::operator++(&__begin1);
    pBVar3 = __begin1.bounds;
    iVar1 = __begin1.p.super_Tuple2<pbrt::Point2,_int>.x;
    iVar2 = __begin1.p.super_Tuple2<pbrt::Point2,_int>.y;
  }
  return;
}

Assistant:

TEST(Bounds2, IteratorBasic) {
    Bounds2i b{{0, 1}, {2, 3}};
    Point2i e[] = {{0, 1}, {1, 1}, {0, 2}, {1, 2}};
    int offset = 0;
    for (auto p : b) {
        EXPECT_LT(offset, PBRT_ARRAYSIZE(e));
        EXPECT_EQ(e[offset], p) << "offset = " << offset;
        ++offset;
    }
}